

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void check_full_flip(void)

{
  roaring_bitmap_t *x1;
  roaring_bitmap_t *prVar1;
  roaring_bitmap_t *r1;
  uint64_t bignumber;
  roaring_bitmap_t *rorg;
  uint64_t in_stack_ffffffffffffffe8;
  char *file;
  int line;
  
  x1 = roaring_bitmap_create();
  file = (char *)0x100000000;
  prVar1 = roaring_bitmap_flip(x1,0x100000000,in_stack_ffffffffffffffe8);
  line = (int)((ulong)prVar1 >> 0x20);
  roaring_bitmap_get_cardinality(r1);
  _assert_true((unsigned_long)r1,(char *)x1,file,line);
  roaring_bitmap_free((roaring_bitmap_t *)0x10cffe);
  roaring_bitmap_free((roaring_bitmap_t *)0x10d008);
  return;
}

Assistant:

DEFINE_TEST(check_full_flip) {
    roaring_bitmap_t *rorg = roaring_bitmap_create();
    uint64_t bignumber = UINT64_C(0x100000000);
    roaring_bitmap_t *r1 = roaring_bitmap_flip(rorg, 0, bignumber);
    assert_true(roaring_bitmap_get_cardinality(r1) == bignumber);
    roaring_bitmap_free(r1);
    roaring_bitmap_free(rorg);
}